

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O3

string * __thiscall
jbcoin::STArray::getText_abi_cxx11_(string *__return_storage_ptr__,STArray *this)

{
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  pSVar3 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      (*(pSVar3->super_STBase)._vptr_STBase[6])(local_50,pSVar3);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pSVar3 = pSVar3 + 1;
      bVar2 = false;
    } while (pSVar3 != pSVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string STArray::getText () const
{
    std::string r = "[";

    bool first = true;
    for (STObject const& o : v_)
    {
        if (!first)
            r += ",";

        r += o.getText ();
        first = false;
    }

    r += "]";
    return r;
}